

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate2.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate2<std::complex<double>_>::QRotationGate2
          (QRotationGate2<std::complex<double>_> *this,int *qubits,real_type theta,bool fixed)

{
  bool fixed_local;
  real_type theta_local;
  int *qubits_local;
  QRotationGate2<std::complex<double>_> *this_local;
  
  QGate2<std::complex<double>_>::QGate2(&this->super_QGate2<std::complex<double>_>);
  QAdjustable::QAdjustable(&this->super_QAdjustable,fixed);
  (this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00759d10;
  QRotation<double>::QRotation(&this->rotation_,theta);
  (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>._vptr_QObject
    [6])(this,qubits);
  return;
}

Assistant:

QRotationGate2( const int* qubits , const real_type theta ,
                        const bool fixed = false )
        : rotation_( theta )
        , QAdjustable( fixed )
        {
          setQubits( qubits ) ;
        }